

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_init_mips64(CPUState *cpu)

{
  void *pvVar1;
  long lVar2;
  void *__s;
  gpointer pvVar3;
  undefined4 *puVar4;
  long lVar5;
  timeval tv;
  timeval local_30;
  
  pvVar1 = cpu->env_ptr;
  lVar5 = 0;
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  *(undefined2 *)((long)pvVar1 + -0xb50) = 0;
  puVar4 = (undefined4 *)((long)pvVar1 + -0xb30);
  do {
    *(__suseconds_t *)(puVar4 + 4) = local_30.tv_usec * 1000 + local_30.tv_sec * 1000000000;
    *(undefined1 (*) [16])(puVar4 + 6) = (undefined1  [16])0x0;
    *(undefined8 *)((long)pvVar1 + lVar5 + -0x50) = 0x3fc0;
    pvVar3 = g_malloc(0x4000);
    *(gpointer *)((long)pvVar1 + lVar5 + -0x48) = pvVar3;
    pvVar3 = g_malloc(0x1000);
    *(gpointer *)(puVar4 + 0xac) = pvVar3;
    lVar2 = *(long *)((long)pvVar1 + lVar5 + -0x50);
    __s = *(void **)((long)pvVar1 + lVar5 + -0x48);
    *(undefined1 (*) [16])(puVar4 + 8) = (undefined1  [16])0x0;
    *puVar4 = 0xffffffff;
    puVar4[1] = 0xffffffff;
    puVar4[2] = 0xffffffff;
    puVar4[3] = 0xffffffff;
    memset(__s,0xff,lVar2 + 0x40);
    memset(puVar4 + 0xc,0xff,0x200);
    lVar5 = lVar5 + 0x10;
    puVar4 = puVar4 + 0xae;
  } while (lVar5 != 0x40);
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}